

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitemanimation.cpp
# Opt level: O1

void __thiscall
QGraphicsItemAnimationPrivate::insertUniquePair
          (QGraphicsItemAnimationPrivate *this,qreal step,qreal value,
          QList<QGraphicsItemAnimationPrivate::Pair> *binList,char *method)

{
  ulong uVar1;
  iterator iVar2;
  iterator iVar3;
  difference_type __d;
  ulong uVar4;
  long in_FS_OFFSET;
  Pair local_38;
  undefined4 uStack_28;
  undefined4 local_24;
  char *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((step < 0.0) || (1.0 < step)) {
    local_38.step._0_4_ = 2;
    local_38.step._4_4_ = 0;
    local_38.value._0_4_ = 0;
    local_38.value._4_4_ = 0;
    uStack_28 = 0;
    local_24 = 0;
    local_20 = "default";
    QMessageLogger::warning((char *)&local_38,"QGraphicsItemAnimation::%s: invalid step = %f");
  }
  else {
    local_38.step = step;
    local_38.value = value;
    iVar2 = QList<QGraphicsItemAnimationPrivate::Pair>::begin(binList);
    iVar3 = QList<QGraphicsItemAnimationPrivate::Pair>::end(binList);
    uVar4 = (long)iVar3.i - (long)iVar2.i >> 4;
    while (uVar1 = uVar4, 0 < (long)uVar1) {
      uVar4 = uVar1 >> 1;
      if (iVar2.i[uVar4].step <= local_38.step && local_38.step != iVar2.i[uVar4].step) {
        iVar2.i = iVar2.i + uVar4 + 1;
        uVar4 = ~uVar4 + uVar1;
      }
    }
    iVar3 = QList<QGraphicsItemAnimationPrivate::Pair>::end(binList);
    if ((iVar2.i == iVar3.i) || (local_38.step < (iVar2.i)->step)) {
      QtPrivate::QPodArrayOps<QGraphicsItemAnimationPrivate::Pair>::insert
                ((QPodArrayOps<QGraphicsItemAnimationPrivate::Pair> *)binList,
                 (long)iVar2.i - (long)(binList->d).ptr >> 4,1,&local_38);
      QList<QGraphicsItemAnimationPrivate::Pair>::begin(binList);
    }
    else {
      (iVar2.i)->value = value;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemAnimationPrivate::insertUniquePair(qreal step, qreal value, QList<Pair> *binList,
                                                     const char *method)
{
    if (!check_step_valid(step, method))
        return;

    const Pair pair = { step, value };

    const QList<Pair>::iterator result = std::lower_bound(binList->begin(), binList->end(), pair);
    if (result == binList->end() || pair < *result)
        binList->insert(result, pair);
    else
        result->value = value;
}